

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

Queue * Queue_Fit(Queue *__return_storage_ptr__,Queue *q,size_t offset)

{
  ulong local_20;
  size_t i;
  size_t offset_local;
  Queue *q_local;
  
  if ((offset < q->size) && (offset != 0)) {
    __return_storage_ptr__->size = q->size - offset;
    __return_storage_ptr__->first = q->first;
    __return_storage_ptr__->last = q->last;
    for (local_20 = 0; local_20 < offset; local_20 = local_20 + 1) {
      __return_storage_ptr__->first = __return_storage_ptr__->first->prev;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("q->size>offset && offset>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/queue.c"
                ,0x73,"struct Queue Queue_Fit(struct Queue *, size_t)");
}

Assistant:

struct Queue Queue_Fit(struct Queue *q,size_t offset)
{
	assert(q->size>offset && offset>0);

	struct Queue ret;
	size_t i;

	ret.size=q->size-offset;
	ret.first=q->first;
	ret.last=q->last;

	for(i=0;i<offset;++i)
	{
		ret.first=ret.first->prev;
	}
	return ret;
	
}